

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_int_2_suite::test_same(void)

{
  undefined4 local_90;
  value_type_conflict1 local_8c [2];
  undefined4 local_84;
  size_type local_80;
  undefined1 local_76;
  undefined1 local_75 [2];
  undefined1 local_73;
  undefined1 local_72 [2];
  undefined4 local_70;
  value_type_conflict1 local_6c [2];
  undefined4 local_64;
  size_type local_60 [2];
  undefined4 local_50;
  value_type_conflict1 local_4c [2];
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  moment<int,_2> filter;
  
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_40[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_44 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a2,"void mean_int_2_suite::test_same()",local_40,&local_44);
  local_4c[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_50 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a3,"void mean_int_2_suite::test_same()",local_4c,&local_50);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_60[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_64 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a5,"void mean_int_2_suite::test_same()",local_60,&local_64);
  local_6c[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_70 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a6,"void mean_int_2_suite::test_same()",local_6c,&local_70);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_72[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::empty
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_73 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a8,"void mean_int_2_suite::test_same()",local_72,&local_73);
  local_75[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::full
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_76 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a9,"void mean_int_2_suite::test_same()",local_75,&local_76);
  local_80 = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_84 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1aa,"void mean_int_2_suite::test_same()",&local_80,&local_84);
  local_8c[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_90 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ab,"void mean_int_2_suite::test_same()",local_8c,&local_90);
  return;
}

Assistant:

void test_same()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(1);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1);
}